

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

qpdf_object_type_e __thiscall QPDFObject::getResolvedTypeCode(QPDFObject *this)

{
  qpdf_object_type_e qVar1;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  QPDFObject *this_local;
  
  qVar1 = getTypeCode(this);
  if (qVar1 == ot_unresolved) {
    p_Var2 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             QPDF::Resolver::resolved(this->qpdf,this->og);
    peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    this_local._4_4_ = getTypeCode(peVar3);
  }
  else {
    qVar1 = getTypeCode(this);
    if (qVar1 == ot_reference) {
      p_Var2 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::
               get<QPDF_Reference,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&this->value);
      peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var2);
      this_local._4_4_ = getTypeCode(peVar3);
    }
    else {
      this_local._4_4_ = getTypeCode(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

inline qpdf_object_type_e
QPDFObject::getResolvedTypeCode() const
{
    if (getTypeCode() == ::ot_unresolved) {
        return QPDF::Resolver::resolved(qpdf, og)->getTypeCode();
    }
    if (getTypeCode() == ::ot_reference) {
        return std::get<QPDF_Reference>(value).obj->getTypeCode();
    }
    return getTypeCode();
}